

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O0

void objaddsc(mcmcxdef *mctx,int sccnt,objnum objn)

{
  ushort uVar1;
  mcmon **ppmVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  long lVar9;
  ushort in_DX;
  int in_ESI;
  undefined8 *in_RDI;
  ushort siz;
  objdef *o;
  mcmcxdef *in_stack_ffffffffffffffa0;
  mcmcxdef *in_stack_ffffffffffffffa8;
  objnum obj;
  mcmcxdef *in_stack_ffffffffffffffb0;
  uchar *puVar10;
  uchar *local_18;
  
  local_18 = mcmlck(in_stack_ffffffffffffffa8,(mcmon)((ulong)in_stack_ffffffffffffffa0 >> 0x30));
  obj = (objnum)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  uVar1 = *(ushort *)
           (*(long *)(*(long *)*in_RDI +
                     (long)((int)(uint)*(ushort *)
                                        (in_RDI[(long)((int)(uint)in_DX >> 8) + 6] +
                                        (long)(int)(in_DX & 0xff) * 2) >> 8) * 8) +
            (long)(int)(*(ushort *)
                         (in_RDI[(long)((int)(uint)in_DX >> 8) + 6] + (long)(int)(in_DX & 0xff) * 2)
                       & 0xff) * 0x20 + 0x18);
  uVar3 = osrp2(local_18 + 8);
  iVar4 = (uint)uVar1 - (uVar3 & 0xffff);
  if (SBORROW4(iVar4,in_ESI * 2) != iVar4 + in_ESI * -2 < 0) {
    osrp2(local_18 + 8);
    local_18 = objexp(in_stack_ffffffffffffffb0,obj,(ushort *)in_stack_ffffffffffffffa0);
  }
  iVar4 = osrp2(local_18 + 6);
  if ((short)iVar4 != 0) {
    in_stack_ffffffffffffffa0 = (mcmcxdef *)(local_18 + 0xe);
    uVar3 = osrp2(local_18 + 4);
    ppmVar2 = in_stack_ffffffffffffffa0->mcmcxmtb;
    puVar8 = local_18 + 0xe;
    uVar5 = osrp2(local_18 + 4);
    puVar10 = local_18;
    uVar6 = osrp2(local_18 + 8);
    uVar7 = osrp2(local_18 + 4);
    memmove((void *)((long)ppmVar2 + (long)(int)((uVar3 & 0xffff) << 1) + -0x30),
            puVar8 + (long)(in_ESI << 1) + (long)(int)((uVar5 & 0xffff) << 1),
            (size_t)(puVar10 +
                    ((long)(int)(uVar6 & 0xffff) -
                    (long)(local_18 + (long)(int)((uVar7 & 0xffff) << 1) + 0xe))));
  }
  uVar3 = osrp2(local_18 + 8);
  oswp2(local_18 + 8,(uVar3 & 0xffff) + in_ESI * 2);
  lVar9 = *(long *)(*(long *)*in_RDI +
                   (long)((int)(uint)*(ushort *)
                                      (in_RDI[(long)((int)(uint)in_DX >> 8) + 6] +
                                      (long)(int)(in_DX & 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (in_RDI[(long)((int)(uint)in_DX >> 8) + 6] + (long)(int)(in_DX & 0xff) * 2) &
                     0xff) * 0x20;
  *(ushort *)(lVar9 + 0x14) = *(ushort *)(lVar9 + 0x14) | 1;
  mcmunlck(in_stack_ffffffffffffffa0,(mcmon)((ulong)(local_18 + 8) >> 0x30));
  return;
}

Assistant:

void objaddsc(mcmcxdef *mctx, int sccnt, objnum objn)
{
    objdef *o;
    ushort  siz;
    
    /* get lock on object */
    o = (objdef *)mcmlck(mctx, objn);
    
    /* make sure there's enough space, adding space if needed */
    if (mcmobjsiz(mctx, (mcmon)objn) - objfree(o) < 2 * sccnt)
    {
        siz = 64 + ((2 * sccnt + objfree(o)) -
                    mcmobjsiz(mctx, (mcmon)objn));
        o = objexp(mctx, objn, &siz);                  /* expand the object */
    }

    /* move properties, if any, above added superclasses */
    if (objnprop(o))
        memmove(objprp(o), ((uchar *)objprp(o)) + 2 * sccnt,
                (size_t)(((uchar *)o) + objfree(o) - (uchar *)objprp(o)));
    
    /* set new free pointer */
    objsfree(o, objfree(o) + 2 * sccnt);
    
    /* mark cache object modified and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
}